

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

int luaL_getsubtable(lua_State *L,int idx,char *fname)

{
  int iVar1;
  int idx_00;
  char *fname_local;
  int idx_local;
  lua_State *L_local;
  
  iVar1 = lua_getfield(L,idx,fname);
  if (iVar1 != 5) {
    lua_settop(L,-2);
    idx_00 = lua_absindex(L,idx);
    lua_createtable(L,0,0);
    lua_pushvalue(L,-1);
    lua_setfield(L,idx_00,fname);
  }
  L_local._4_4_ = (uint)(iVar1 == 5);
  return L_local._4_4_;
}

Assistant:

LUALIB_API int luaL_getsubtable (lua_State *L, int idx, const char *fname) {
  if (lua_getfield(L, idx, fname) == LUA_TTABLE)
    return 1;  /* table already there */
  else {
    lua_pop(L, 1);  /* remove previous result */
    idx = lua_absindex(L, idx);
    lua_newtable(L);
    lua_pushvalue(L, -1);  /* copy to be left at top */
    lua_setfield(L, idx, fname);  /* assign new table to field */
    return 0;  /* false, because did not find table there */
  }
}